

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O1

_Bool chck_string_set_cstr_with_length(chck_string *string,char *data,size_t len,_Bool is_heap)

{
  char *__dest;
  
  if (string == (chck_string *)0x0) {
    __assert_fail("string",
                  "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/string/string.c"
                  ,0x21,
                  "_Bool chck_string_set_cstr_with_length(struct chck_string *, const char *, size_t, _Bool)"
                 );
  }
  __dest = data;
  if (len != 0 && (is_heap && data != (char *)0x0)) {
    if (len + 1 == 0) {
      __dest = (char *)0x0;
    }
    else {
      __dest = (char *)calloc(1,len + 1);
    }
    if (__dest == (char *)0x0) {
      __dest = (char *)0x0;
    }
    else {
      memcpy(__dest,data,len);
    }
    if (__dest == (char *)0x0) {
      return false;
    }
  }
  if (string->is_heap == true) {
    free(string->data);
  }
  string->data = (char *)0x0;
  string->size = 0;
  *(undefined8 *)&string->is_heap = 0;
  if (len == 0) {
    __dest = (char *)0x0;
  }
  string->is_heap = is_heap;
  string->data = __dest;
  string->size = len;
  return true;
}

Assistant:

bool
chck_string_set_cstr_with_length(struct chck_string *string, const char *data, size_t len, bool is_heap)
{
   assert(string);

   char *copy = (char*)data;
   if (is_heap && data && len > 0 && !(copy = ccopy(data, len)))
      return false;

   chck_string_release(string);
   string->is_heap = is_heap;
   string->data = (len > 0 ? copy : NULL);
   string->size = len;
   return true;
}